

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-s-parser.cpp
# Opt level: O3

void __thiscall wasm::SExpressionWasmBuilder::parseImport(SExpressionWasmBuilder *this,Element *s)

{
  pointer *ppNVar1;
  HeapType *this_00;
  _Rb_tree_header *p_Var2;
  pointer puVar3;
  _Head_base<0UL,_wasm::Global_*,_false> _Var4;
  size_t sVar5;
  uint uVar6;
  bool bVar7;
  bool bVar8;
  _Head_base<0UL,_wasm::Function_*,_false> curr;
  uint uVar9;
  bool bVar10;
  undefined4 uVar11;
  List *pLVar12;
  Element *pEVar13;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  SExpressionWasmBuilder *pSVar15;
  long *plVar16;
  undefined7 extraout_var_02;
  size_t sVar17;
  mapped_type *pmVar18;
  Tag *curr_00;
  Function *pFVar19;
  SExpressionWasmBuilder *s_00;
  Address AVar20;
  string *psVar21;
  uint uVar22;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  ulong uVar23;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  uint uVar24;
  iterator iVar25;
  vector<wasm::Name,std::allocator<wasm::Name>> *this_01;
  SExpressionWasmBuilder *pSVar26;
  undefined4 uVar27;
  undefined1 *puVar28;
  uint uVar29;
  SExpressionWasmBuilder *s_01;
  bool bVar30;
  IString str;
  IString str_00;
  string_view s_02;
  IString str_01;
  string_view s_03;
  string_view s_04;
  IString str_02;
  IString IVar31;
  string_view sVar32;
  Signature SVar33;
  undefined1 *local_158;
  long local_150;
  undefined1 local_148 [16];
  undefined1 *local_138;
  long local_130;
  undefined1 local_128 [16];
  undefined1 *local_118;
  long local_110;
  undefined1 local_108 [16];
  undefined1 *local_f8;
  long local_f0;
  undefined1 local_e8 [16];
  undefined1 *local_d8;
  long local_d0;
  undefined1 local_c8 [16];
  long *local_b8 [2];
  long local_a8 [2];
  HeapType *local_98;
  SExpressionWasmBuilder *local_90;
  string_view local_88;
  undefined8 local_78;
  undefined8 local_70;
  _Head_base<0UL,_wasm::Function_*,_false> local_68;
  __single_object func;
  undefined1 local_58 [16];
  undefined1 *local_48;
  undefined4 local_3c;
  SExpressionWasmBuilder *local_38;
  undefined8 uVar14;
  
  local_90 = this;
  pLVar12 = Element::list(s);
  local_38 = (SExpressionWasmBuilder *)s;
  if ((pLVar12->super_ArenaVectorBase<ArenaVector<wasm::Element_*>,_wasm::Element_*>).usedElements
      == 4) {
    pEVar13 = Element::operator[](s,3);
    if (pEVar13->isList_ != true) {
      goto LAB_0098963d;
    }
    pEVar13 = Element::operator[](s,3);
    IVar31.str._M_str = extraout_RDX;
    IVar31.str._M_len = DAT_00da7e80;
    bVar10 = elementStartsWith(pEVar13,IVar31);
    uVar14 = CONCAT71(extraout_var,bVar10);
    if (bVar10) {
      bVar10 = true;
      bVar7 = false;
      bVar8 = false;
      local_3c = 0;
      local_70 = (char *)((ulong)local_70 & 0xffffffff00000000);
LAB_009896d4:
      bVar30 = false;
      uVar24 = (uint)CONCAT71((int7)((ulong)uVar14 >> 8),1);
    }
    else {
      pEVar13 = Element::operator[](s,3);
      str.str._M_str = extraout_RDX_00;
      str.str._M_len = DAT_00da7eb0;
      bVar10 = elementStartsWith(pEVar13,str);
      uVar14 = CONCAT71(extraout_var_00,bVar10);
      if (bVar10) {
        local_70 = (char *)CONCAT44(local_70._4_4_,2);
        bVar8 = true;
        bVar7 = false;
LAB_0098968c:
        local_3c = 0;
LAB_009896d1:
        bVar10 = false;
        goto LAB_009896d4;
      }
      pEVar13 = Element::operator[](s,3);
      str_00.str._M_str = extraout_RDX_01;
      str_00.str._M_len = DAT_00da7f00;
      bVar10 = elementStartsWith(pEVar13,str_00);
      if (bVar10) {
        local_70 = (char *)CONCAT44(local_70._4_4_,1);
        uVar14 = CONCAT71(extraout_var_01,1);
        local_3c = (undefined4)uVar14;
        bVar7 = false;
        bVar8 = false;
        goto LAB_009896d1;
      }
      pEVar13 = Element::operator[](s,3);
      str_01.str._M_str = extraout_RDX_02;
      str_01.str._M_len = DAT_00da7e70;
      bVar10 = elementStartsWith(pEVar13,str_01);
      uVar14 = CONCAT71(extraout_var_02,bVar10);
      if (bVar10) {
        local_70 = (char *)CONCAT44(local_70._4_4_,3);
        bVar7 = true;
        bVar8 = false;
        goto LAB_0098968c;
      }
      pEVar13 = Element::operator[](s,3);
      bVar10 = false;
      pEVar13 = Element::operator[](pEVar13,0);
      IVar31 = Element::str(pEVar13);
      bVar30 = IVar31.str._M_str == DAT_00da80d0;
      local_70 = (char *)CONCAT44(local_70._4_4_,(uint)bVar30 * 5 + -1);
      bVar7 = false;
      bVar8 = false;
      local_3c = 0;
      uVar24 = (uint)bVar30;
    }
    local_78 = (char *)CONCAT44(local_78._4_4_,uVar24);
  }
  else {
LAB_0098963d:
    local_70 = (char *)CONCAT44(local_70._4_4_,0xffffffff);
    bVar10 = false;
    bVar7 = false;
    bVar8 = false;
    local_3c = 0;
    bVar30 = false;
    local_78 = (char *)((ulong)local_78._4_4_ << 0x20);
  }
  pSVar15 = local_38;
  local_88 = (string_view)ZEXT816(0);
  pLVar12 = Element::list((Element *)local_38);
  if (((pLVar12->super_ArenaVectorBase<ArenaVector<wasm::Element_*>,_wasm::Element_*>).usedElements
       < 4) || (pEVar13 = Element::operator[]((Element *)pSVar15,3), pEVar13->isList_ == true)) {
    if ((char)local_78 != '\0') {
      pEVar13 = Element::operator[]((Element *)local_38,3);
      pLVar12 = Element::list(pEVar13);
      if (1 < (pLVar12->super_ArenaVectorBase<ArenaVector<wasm::Element_*>,_wasm::Element_*>).
              usedElements) {
        pEVar13 = Element::operator[]((Element *)local_38,3);
        pEVar13 = Element::operator[](pEVar13,1);
        if ((pEVar13->isList_ == false) && ((pEVar13->dollared_ & 1U) != 0)) {
          pSVar15 = (SExpressionWasmBuilder *)Element::operator[]((Element *)local_38,3);
          local_98 = (HeapType *)&DAT_00000001;
          local_48 = (undefined1 *)0x2;
          goto LAB_009898b9;
        }
      }
    }
    local_98 = (HeapType *)&DAT_00000001;
    local_48 = &DAT_00000001;
  }
  else {
    local_98 = (HeapType *)0x2;
    local_48 = &DAT_00000001;
LAB_009898b9:
    pEVar13 = Element::operator[]((Element *)pSVar15,1);
    local_88 = (string_view)Element::str(pEVar13);
    uVar11 = (undefined4)CONCAT71(local_88._M_len._1_7_,1);
    if (local_88._M_str != (char *)0x0) goto LAB_00989e45;
  }
  if (bVar10) {
    uVar24 = local_90->functionCounter;
    local_90->functionCounter = uVar24 + 1;
    uVar6 = -uVar24;
    if (0 < (int)uVar24) {
      uVar6 = uVar24;
    }
    uVar29 = 1;
    if (9 < uVar6) {
      uVar23 = (ulong)uVar6;
      uVar9 = 4;
      do {
        uVar29 = uVar9;
        uVar22 = (uint)uVar23;
        if (uVar22 < 100) {
          uVar29 = uVar29 - 2;
          goto LAB_00989978;
        }
        if (uVar22 < 1000) {
          uVar29 = uVar29 - 1;
          goto LAB_00989978;
        }
        if (uVar22 < 10000) goto LAB_00989978;
        uVar23 = uVar23 / 10000;
        uVar9 = uVar29 + 4;
      } while (99999 < uVar22);
      uVar29 = uVar29 + 1;
    }
LAB_00989978:
    local_b8[0] = local_a8;
    std::__cxx11::string::_M_construct((ulong)local_b8,(char)uVar29 - (char)((int)uVar24 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)local_b8[0] + (ulong)(uVar24 >> 0x1f)),uVar29,uVar6);
    plVar16 = (long *)std::__cxx11::string::replace((ulong)local_b8,0,(char *)0x0,0xba4af6);
    pSVar15 = local_90;
    pFVar19 = (Function *)(plVar16 + 2);
    if ((Function *)*plVar16 == pFVar19) {
      local_58._0_8_ = (pFVar19->super_Importable).super_Named.name.super_IString.str._M_len;
      local_58._8_8_ = plVar16[3];
      local_68._M_head_impl = (Function *)local_58;
    }
    else {
      local_58._0_8_ = (pFVar19->super_Importable).super_Named.name.super_IString.str._M_len;
      local_68._M_head_impl = (Function *)*plVar16;
    }
    func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
         *(__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true> *)
          &((__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_> *)(plVar16 + 1))
           ->_M_t;
    *plVar16 = (long)pFVar19;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    s_02._M_str = (char *)0x0;
    s_02._M_len = (size_t)local_68._M_head_impl;
    local_88 = IString::interned((IString *)
                                 func._M_t.
                                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                 .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,s_02,
                                 SUB81(pFVar19,0));
    if (local_68._M_head_impl != (Function *)local_58) {
      operator_delete(local_68._M_head_impl,local_58._0_8_ + 1);
    }
    if (local_b8[0] != local_a8) {
      operator_delete(local_b8[0],local_a8[0] + 1);
    }
    iVar25._M_current =
         (pSVar15->functionNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar25._M_current ==
        (pSVar15->functionNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      this_01 = (vector<wasm::Name,std::allocator<wasm::Name>> *)&pSVar15->functionNames;
LAB_00989a79:
      std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
                (this_01,iVar25,(Name *)&local_88);
    }
    else {
      ((iVar25._M_current)->super_IString).str._M_len = local_88._M_len;
      ((iVar25._M_current)->super_IString).str._M_str = local_88._M_str;
      ppNVar1 = &(pSVar15->functionNames).
                 super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppNVar1 = *ppNVar1 + 1;
    }
  }
  else if (!bVar7) {
    if (bVar8) {
      uVar24 = local_90->memoryCounter;
      local_90->memoryCounter = uVar24 + 1;
      uVar6 = -uVar24;
      if (0 < (int)uVar24) {
        uVar6 = uVar24;
      }
      uVar29 = 1;
      if (9 < uVar6) {
        uVar23 = (ulong)uVar6;
        uVar9 = 4;
        do {
          uVar29 = uVar9;
          uVar22 = (uint)uVar23;
          if (uVar22 < 100) {
            uVar29 = uVar29 - 2;
            goto LAB_00989b9d;
          }
          if (uVar22 < 1000) {
            uVar29 = uVar29 - 1;
            goto LAB_00989b9d;
          }
          if (uVar22 < 10000) goto LAB_00989b9d;
          uVar23 = uVar23 / 10000;
          uVar9 = uVar29 + 4;
        } while (99999 < uVar22);
        uVar29 = uVar29 + 1;
      }
LAB_00989b9d:
      local_b8[0] = local_a8;
      std::__cxx11::string::_M_construct((ulong)local_b8,(char)uVar29 - (char)((int)uVar24 >> 0x1f))
      ;
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((long)local_b8[0] + (ulong)(uVar24 >> 0x1f)),uVar29,uVar6);
      plVar16 = (long *)std::__cxx11::string::replace((ulong)local_b8,0,(char *)0x0,0xba4b72);
      local_68._M_head_impl = (Function *)local_58;
      pFVar19 = (Function *)(plVar16 + 2);
      if ((Function *)*plVar16 == pFVar19) {
        local_58._0_8_ = (pFVar19->super_Importable).super_Named.name.super_IString.str._M_len;
        local_58._8_8_ = plVar16[3];
      }
      else {
        local_58._0_8_ = (pFVar19->super_Importable).super_Named.name.super_IString.str._M_len;
        local_68._M_head_impl = (Function *)*plVar16;
      }
      func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
      super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
           *(__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true> *)
            &((__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_> *)(plVar16 + 1)
             )->_M_t;
      *plVar16 = (long)pFVar19;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      s_03._M_str = (char *)0x0;
      s_03._M_len = (size_t)local_68._M_head_impl;
      local_88 = IString::interned((IString *)
                                   func._M_t.
                                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                   .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,s_03
                                   ,SUB81(pFVar19,0));
    }
    else {
      if ((char)local_3c == '\0') {
        if (!bVar30) {
          psVar21 = (string *)__cxa_allocate_exception(0x30);
          local_158 = local_148;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"invalid import","");
          pEVar13 = Element::operator[]((Element *)local_38,3);
          sVar17 = pEVar13->line;
          pEVar13 = Element::operator[]((Element *)local_38,3);
          sVar5 = pEVar13->col;
          *(string **)psVar21 = psVar21 + 0x10;
          std::__cxx11::string::_M_construct<char*>(psVar21,local_158,local_158 + local_150);
          *(size_t *)(psVar21 + 0x20) = sVar17;
          *(size_t *)(psVar21 + 0x28) = sVar5;
          __cxa_throw(psVar21,&ParseException::typeinfo,ParseException::~ParseException);
        }
        uVar24 = local_90->tagCounter;
        local_90->tagCounter = uVar24 + 1;
        uVar6 = -uVar24;
        if (0 < (int)uVar24) {
          uVar6 = uVar24;
        }
        uVar29 = 1;
        if (9 < uVar6) {
          uVar23 = (ulong)uVar6;
          uVar9 = 4;
          do {
            uVar29 = uVar9;
            uVar22 = (uint)uVar23;
            if (uVar22 < 100) {
              uVar29 = uVar29 - 2;
              goto LAB_00989d3e;
            }
            if (uVar22 < 1000) {
              uVar29 = uVar29 - 1;
              goto LAB_00989d3e;
            }
            if (uVar22 < 10000) goto LAB_00989d3e;
            uVar23 = uVar23 / 10000;
            uVar9 = uVar29 + 4;
          } while (99999 < uVar22);
          uVar29 = uVar29 + 1;
        }
LAB_00989d3e:
        local_b8[0] = local_a8;
        std::__cxx11::string::_M_construct
                  ((ulong)local_b8,(char)uVar29 - (char)((int)uVar24 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((long)local_b8[0] + (ulong)(uVar24 >> 0x1f)),uVar29,uVar6);
        plVar16 = (long *)std::__cxx11::string::replace((ulong)local_b8,0,(char *)0x0,0xba4b84);
        pSVar15 = local_90;
        pFVar19 = (Function *)(plVar16 + 2);
        if ((Function *)*plVar16 == pFVar19) {
          local_58._0_8_ = (pFVar19->super_Importable).super_Named.name.super_IString.str._M_len;
          local_58._8_8_ = plVar16[3];
          local_68._M_head_impl = (Function *)local_58;
        }
        else {
          local_58._0_8_ = (pFVar19->super_Importable).super_Named.name.super_IString.str._M_len;
          local_68._M_head_impl = (Function *)*plVar16;
        }
        func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
        super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
             *(__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true> *)
              &((__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_> *)
               (plVar16 + 1))->_M_t;
        *plVar16 = (long)pFVar19;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        sVar32._M_str = (char *)0x0;
        sVar32._M_len = (size_t)local_68._M_head_impl;
        local_88 = IString::interned((IString *)
                                     func._M_t.
                                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                     .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,
                                     sVar32,SUB81(pFVar19,0));
        if (local_68._M_head_impl != (Function *)local_58) {
          operator_delete(local_68._M_head_impl,local_58._0_8_ + 1);
        }
        if (local_b8[0] != local_a8) {
          operator_delete(local_b8[0],local_a8[0] + 1);
        }
        iVar25._M_current =
             (pSVar15->tagNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl
             .super__Vector_impl_data._M_finish;
        if (iVar25._M_current ==
            (pSVar15->tagNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          this_01 = (vector<wasm::Name,std::allocator<wasm::Name>> *)&pSVar15->tagNames;
          goto LAB_00989a79;
        }
        ((iVar25._M_current)->super_IString).str._M_len = local_88._M_len;
        ((iVar25._M_current)->super_IString).str._M_str = local_88._M_str;
        ppNVar1 = &(pSVar15->tagNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppNVar1 = *ppNVar1 + 1;
        goto LAB_00989e43;
      }
      uVar24 = local_90->tableCounter;
      local_90->tableCounter = uVar24 + 1;
      uVar6 = -uVar24;
      if (0 < (int)uVar24) {
        uVar6 = uVar24;
      }
      uVar29 = 1;
      if (9 < uVar6) {
        uVar23 = (ulong)uVar6;
        uVar9 = 4;
        do {
          uVar29 = uVar9;
          uVar22 = (uint)uVar23;
          if (uVar22 < 100) {
            uVar29 = uVar29 - 2;
            goto LAB_00989c57;
          }
          if (uVar22 < 1000) {
            uVar29 = uVar29 - 1;
            goto LAB_00989c57;
          }
          if (uVar22 < 10000) goto LAB_00989c57;
          uVar23 = uVar23 / 10000;
          uVar9 = uVar29 + 4;
        } while (99999 < uVar22);
        uVar29 = uVar29 + 1;
      }
LAB_00989c57:
      local_b8[0] = local_a8;
      std::__cxx11::string::_M_construct((ulong)local_b8,(char)uVar29 - (char)((int)uVar24 >> 0x1f))
      ;
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((long)local_b8[0] + (ulong)(uVar24 >> 0x1f)),uVar29,uVar6);
      plVar16 = (long *)std::__cxx11::string::replace((ulong)local_b8,0,(char *)0x0,0xba4b37);
      local_68._M_head_impl = (Function *)local_58;
      pFVar19 = (Function *)(plVar16 + 2);
      if ((Function *)*plVar16 == pFVar19) {
        local_58._0_8_ = (pFVar19->super_Importable).super_Named.name.super_IString.str._M_len;
        local_58._8_8_ = plVar16[3];
      }
      else {
        local_58._0_8_ = (pFVar19->super_Importable).super_Named.name.super_IString.str._M_len;
        local_68._M_head_impl = (Function *)*plVar16;
      }
      func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
      super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
           *(__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true> *)
            &((__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_> *)(plVar16 + 1)
             )->_M_t;
      *plVar16 = (long)pFVar19;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      s_04._M_str = (char *)0x0;
      s_04._M_len = (size_t)local_68._M_head_impl;
      local_88 = IString::interned((IString *)
                                   func._M_t.
                                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                   .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,s_04
                                   ,SUB81(pFVar19,0));
    }
    if (local_68._M_head_impl != (Function *)local_58) {
      operator_delete(local_68._M_head_impl,local_58._0_8_ + 1);
    }
    if (local_b8[0] != local_a8) {
      operator_delete(local_b8[0],local_a8[0] + 1);
    }
  }
LAB_00989e43:
  uVar11 = 0;
LAB_00989e45:
  pSVar15 = local_38;
  uVar27 = 0;
  if ((char)local_78 != '\0') {
    uVar27 = (undefined4)local_70;
  }
  uVar24 = (uint)local_98;
  local_3c = uVar11;
  pEVar13 = Element::operator[]((Element *)local_38,uVar24);
  IVar31 = Element::str(pEVar13);
  local_70 = IVar31.str._M_str;
  sVar17 = IVar31.str._M_len;
  uVar24 = uVar24 + 1;
  pEVar13 = Element::operator[]((Element *)pSVar15,uVar24);
  if (pEVar13->isList_ == true) {
    psVar21 = (string *)__cxa_allocate_exception(0x30);
    local_138 = local_128;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"no name for import","");
    pEVar13 = Element::operator[]((Element *)local_38,uVar24);
    sVar17 = pEVar13->line;
    pEVar13 = Element::operator[]((Element *)local_38,uVar24);
    sVar5 = pEVar13->col;
    *(string **)psVar21 = psVar21 + 0x10;
    std::__cxx11::string::_M_construct<char*>(psVar21,local_138,local_138 + local_130);
    *(size_t *)(psVar21 + 0x20) = sVar17;
    *(size_t *)(psVar21 + 0x28) = sVar5;
    __cxa_throw(psVar21,&ParseException::typeinfo,ParseException::~ParseException);
  }
  pEVar13 = Element::operator[]((Element *)pSVar15,uVar24);
  sVar32 = (string_view)Element::str(pEVar13);
  if ((sVar17 == 0) || (sVar32._M_len == 0)) {
    psVar21 = (string *)__cxa_allocate_exception(0x30);
    local_118 = local_108;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,"imports must have module and base","");
    pEVar13 = Element::operator[]((Element *)local_38,uVar24);
    sVar17 = pEVar13->line;
    pEVar13 = Element::operator[]((Element *)local_38,uVar24);
    sVar5 = pEVar13->col;
    *(string **)psVar21 = psVar21 + 0x10;
    std::__cxx11::string::_M_construct<char*>(psVar21,local_118,local_118 + local_110);
    *(size_t *)(psVar21 + 0x20) = sVar17;
    *(size_t *)(psVar21 + 0x28) = sVar5;
    __cxa_throw(psVar21,&ParseException::typeinfo,ParseException::~ParseException);
  }
  if ((char)local_78 == '\0') {
    local_48 = (undefined1 *)((long)&local_98->id + 2);
  }
  else {
    local_38 = (SExpressionWasmBuilder *)Element::operator[]((Element *)local_38,3);
  }
  s_01 = local_38;
  pSVar15 = local_90;
  puVar28 = local_48;
  switch(uVar27) {
  case 0:
    local_78 = sVar32._M_str;
    pFVar19 = (Function *)operator_new(0x1f8);
    this_00 = &pFVar19->type;
    memset(pFVar19,0,0x1f8);
    HeapType::HeapType(this_00,(Signature)ZEXT816(0));
    pSVar15 = local_90;
    pFVar19->profile = Normal;
    (pFVar19->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pFVar19->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pFVar19->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pFVar19->body = (Expression *)0x0;
    (pFVar19->stackIR)._M_t.
    super___uniq_ptr_impl<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>,_std::default_delete<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_*,_std::default_delete<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>_>
    .
    super__Head_base<0UL,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_*,_false>
    ._M_head_impl = (vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_> *)0x0;
    (pFVar19->localNames)._M_h._M_buckets = &(pFVar19->localNames)._M_h._M_single_bucket;
    (pFVar19->localNames)._M_h._M_bucket_count = 1;
    (pFVar19->localNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (pFVar19->localNames)._M_h._M_element_count = 0;
    (pFVar19->localNames)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (pFVar19->localNames)._M_h._M_rehash_policy._M_next_resize = 0;
    (pFVar19->localNames)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    (pFVar19->localIndices)._M_h._M_buckets = &(pFVar19->localIndices)._M_h._M_single_bucket;
    (pFVar19->localIndices)._M_h._M_bucket_count = 1;
    (pFVar19->localIndices)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (pFVar19->localIndices)._M_h._M_element_count = 0;
    (pFVar19->localIndices)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (pFVar19->localIndices)._M_h._M_rehash_policy._M_next_resize = 0;
    (pFVar19->localIndices)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    (pFVar19->debugLocations)._M_h._M_buckets = &(pFVar19->debugLocations)._M_h._M_single_bucket;
    (pFVar19->debugLocations)._M_h._M_bucket_count = 1;
    (pFVar19->debugLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (pFVar19->debugLocations)._M_h._M_element_count = 0;
    (pFVar19->debugLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (pFVar19->debugLocations)._M_h._M_rehash_policy._M_next_resize = 0;
    (pFVar19->debugLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    p_Var2 = &(pFVar19->prologLocation)._M_t._M_impl.super__Rb_tree_header;
    (pFVar19->prologLocation)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (pFVar19->prologLocation)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (pFVar19->prologLocation)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var2->_M_header;
    (pFVar19->prologLocation)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var2->_M_header;
    (pFVar19->prologLocation)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var2 = &(pFVar19->epilogLocation)._M_t._M_impl.super__Rb_tree_header;
    (pFVar19->epilogLocation)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (pFVar19->epilogLocation)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (pFVar19->epilogLocation)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var2->_M_header;
    (pFVar19->epilogLocation)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var2->_M_header;
    (pFVar19->epilogLocation)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    (pFVar19->expressionLocations)._M_h._M_buckets =
         &(pFVar19->expressionLocations)._M_h._M_single_bucket;
    (pFVar19->expressionLocations)._M_h._M_bucket_count = 1;
    (pFVar19->expressionLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (pFVar19->expressionLocations)._M_h._M_element_count = 0;
    (pFVar19->expressionLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (pFVar19->expressionLocations)._M_h._M_rehash_policy._M_next_resize = 0;
    (pFVar19->expressionLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    (pFVar19->delimiterLocations)._M_h._M_buckets =
         &(pFVar19->delimiterLocations)._M_h._M_single_bucket;
    (pFVar19->delimiterLocations)._M_h._M_bucket_count = 1;
    (pFVar19->delimiterLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (pFVar19->delimiterLocations)._M_h._M_element_count = 0;
    (pFVar19->delimiterLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    *(undefined8 *)((long)&(pFVar19->delimiterLocations)._M_h._M_single_bucket + 4) = 0;
    (pFVar19->funcLocation).declarations = 0;
    (pFVar19->funcLocation).end = 0;
    (pFVar19->delimiterLocations)._M_h._M_rehash_policy._M_next_resize = 0;
    (pFVar19->delimiterLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_98 = this_00;
    local_68._M_head_impl = pFVar19;
    local_48 = (undefined1 *)parseTypeUse(local_90,(Element *)local_38,(size_t)local_48,this_00);
    (pFVar19->super_Importable).super_Named.name.super_IString.str._M_len = local_88._M_len;
    (pFVar19->super_Importable).super_Named.name.super_IString.str._M_str = local_88._M_str;
    (pFVar19->super_Importable).super_Named.hasExplicitName = SUB41(local_3c,0);
    (pFVar19->super_Importable).module.super_IString.str._M_len = sVar17;
    (pFVar19->super_Importable).module.super_IString.str._M_str = local_70;
    (pFVar19->super_Importable).base.super_IString.str._M_len = sVar32._M_len;
    (pFVar19->super_Importable).base.super_IString.str._M_str = local_78;
    pmVar18 = std::
              map<wasm::Name,_wasm::HeapType,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::HeapType>_>_>
              ::operator[](&pSVar15->functionTypes,(key_type *)&local_88);
    curr._M_head_impl = local_68._M_head_impl;
    pmVar18->id = local_98->id;
    local_68._M_head_impl = (Function *)0x0;
    Module::addFunction(pSVar15->wasm,curr._M_head_impl);
    std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
              ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)&local_68);
    puVar28 = local_48;
    s_01 = local_38;
    break;
  case 1:
    pFVar19 = (Function *)operator_new(0x50);
    *(undefined8 *)&pFVar19->profile = 0;
    (pFVar19->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pFVar19->super_Importable).super_Named.name.super_IString.str._M_len = 0;
    (pFVar19->super_Importable).super_Named.name.super_IString.str._M_str = (char *)0x0;
    *(undefined8 *)&(pFVar19->super_Importable).super_Named.hasExplicitName = 0;
    (pFVar19->super_Importable).module.super_IString.str._M_len = 0;
    (pFVar19->super_Importable).module.super_IString.str._M_str = (char *)0x0;
    (pFVar19->super_Importable).base.super_IString.str._M_len = 0;
    (pFVar19->super_Importable).base.super_IString.str._M_str = (char *)0x0;
    (pFVar19->type).id = 0;
    *(undefined8 *)&pFVar19->profile = 0xffffffff;
    wasm::Type::Type((Type *)&pFVar19->vars,(HeapType)0x1,Nullable);
    puVar28 = local_48;
    pSVar15 = local_90;
    (pFVar19->super_Importable).super_Named.name.super_IString.str._M_len = local_88._M_len;
    (pFVar19->super_Importable).super_Named.name.super_IString.str._M_str = local_88._M_str;
    (pFVar19->super_Importable).super_Named.hasExplicitName = SUB41(local_3c,0);
    (pFVar19->super_Importable).module.super_IString.str._M_len = sVar17;
    (pFVar19->super_Importable).module.super_IString.str._M_str = local_70;
    (pFVar19->super_Importable).base.super_IString.str = sVar32;
    iVar25._M_current =
         (local_90->tableNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_68._M_head_impl = pFVar19;
    if (iVar25._M_current ==
        (local_90->tableNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
                ((vector<wasm::Name,std::allocator<wasm::Name>> *)&local_90->tableNames,iVar25,
                 (Name *)&local_88);
    }
    else {
      ((iVar25._M_current)->super_IString).str._M_len = local_88._M_len;
      ((iVar25._M_current)->super_IString).str._M_str = local_88._M_str;
      ppNVar1 = &(local_90->tableNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppNVar1 = *ppNVar1 + 1;
    }
    s_01 = local_38;
    pLVar12 = Element::list((Element *)local_38);
    if (puVar28 < (undefined1 *)
                  ((pLVar12->super_ArenaVectorBase<ArenaVector<wasm::Element_*>,_wasm::Element_*>).
                   usedElements - 1)) {
      pEVar13 = Element::operator[]((Element *)s_01,(uint)puVar28);
      AVar20 = getAddress(pEVar13);
      (pFVar19->type).id = AVar20.addr;
      checkAddress(AVar20,"excessive table init size",pEVar13);
      puVar28 = (undefined1 *)(ulong)((uint)puVar28 + 1);
    }
    pLVar12 = Element::list((Element *)s_01);
    uVar24 = (uint)puVar28;
    if (((ulong)puVar28 & 0xffffffff) <
        (pLVar12->super_ArenaVectorBase<ArenaVector<wasm::Element_*>,_wasm::Element_*>).usedElements
        - 1) {
      pEVar13 = Element::operator[]((Element *)s_01,uVar24);
      AVar20 = getAddress(pEVar13);
      *(address64_t *)&pFVar19->profile = AVar20.addr;
      checkAddress(AVar20,"excessive table max size",pEVar13);
      uVar24 = uVar24 + 1;
    }
    else {
      *(undefined8 *)&pFVar19->profile = 0xffffffff;
    }
    Module::addTable(pSVar15->wasm,
                     (unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)&local_68);
    if (local_68._M_head_impl != (Function *)0x0) {
      operator_delete(local_68._M_head_impl,0x50);
    }
    puVar28 = (undefined1 *)(ulong)(uVar24 + 1);
    break;
  case 2:
    pFVar19 = (Function *)operator_new(0x58);
    pSVar15 = local_90;
    *(undefined8 *)&pFVar19->profile = 0;
    (pFVar19->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pFVar19->super_Importable).super_Named.name.super_IString.str._M_len = 0;
    (pFVar19->super_Importable).super_Named.name.super_IString.str._M_str = (char *)0x0;
    *(undefined8 *)&(pFVar19->super_Importable).super_Named.hasExplicitName = 0;
    (pFVar19->super_Importable).module.super_IString.str._M_len = 0;
    (pFVar19->super_Importable).module.super_IString.str._M_str = (char *)0x0;
    (pFVar19->super_Importable).base.super_IString.str._M_len = 0;
    (pFVar19->super_Importable).base.super_IString.str._M_str = (char *)0x0;
    (pFVar19->type).id = 0;
    *(undefined8 *)&pFVar19->profile = 0x10000;
    (pFVar19->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x2;
    (pFVar19->super_Importable).super_Named.name.super_IString.str._M_len = local_88._M_len;
    (pFVar19->super_Importable).super_Named.name.super_IString.str._M_str = local_88._M_str;
    (pFVar19->super_Importable).super_Named.hasExplicitName = SUB41(local_3c,0);
    (pFVar19->super_Importable).module.super_IString.str._M_len = sVar17;
    (pFVar19->super_Importable).module.super_IString.str._M_str = local_70;
    (pFVar19->super_Importable).base.super_IString.str = sVar32;
    iVar25._M_current =
         (local_90->memoryNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl
         .super__Vector_impl_data._M_finish;
    local_68._M_head_impl = pFVar19;
    if (iVar25._M_current ==
        (local_90->memoryNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
                ((vector<wasm::Name,std::allocator<wasm::Name>> *)&local_90->memoryNames,iVar25,
                 (Name *)&local_88);
      uVar24 = (uint)local_48;
    }
    else {
      ((iVar25._M_current)->super_IString).str._M_len = local_88._M_len;
      ((iVar25._M_current)->super_IString).str._M_str = local_88._M_str;
      ppNVar1 = &(local_90->memoryNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppNVar1 = *ppNVar1 + 1;
      uVar24 = (uint)local_48;
    }
    s_01 = local_38;
    pSVar26 = local_38;
    pEVar13 = Element::operator[]((Element *)local_38,uVar24);
    if (pEVar13->isList_ == true) {
      s_00 = (SExpressionWasmBuilder *)Element::operator[]((Element *)s_01,uVar24);
      str_02.str._M_str = extraout_RDX_03;
      str_02.str._M_len = DAT_00da80c0;
      pSVar26 = s_00;
      bVar10 = elementStartsWith((Element *)s_00,str_02);
      if (!bVar10) {
        psVar21 = (string *)__cxa_allocate_exception(0x30);
        local_f8 = local_e8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f8,"bad memory limit declaration","");
        pEVar13 = Element::operator[]((Element *)local_38,(uint)local_48);
        sVar17 = pEVar13->line;
        pEVar13 = Element::operator[]((Element *)local_38,(uint)local_48);
        local_38 = (SExpressionWasmBuilder *)pEVar13->col;
        *(string **)psVar21 = psVar21 + 0x10;
        std::__cxx11::string::_M_construct<char*>(psVar21,local_f8,local_f8 + local_f0);
        *(size_t *)(psVar21 + 0x20) = sVar17;
        *(SExpressionWasmBuilder **)(psVar21 + 0x28) = local_38;
        __cxa_throw(psVar21,&ParseException::typeinfo,ParseException::~ParseException);
      }
      *(undefined1 *)
       &(pFVar19->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start = 1;
      uVar24 = parseMemoryLimits(pSVar26,(Element *)s_00,1,
                                 (unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)
                                 &local_68);
    }
    else {
      uVar24 = parseMemoryLimits(pSVar26,(Element *)s_01,uVar24,
                                 (unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)
                                 &local_68);
    }
    Module::addMemory(pSVar15->wasm,
                      (unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)&local_68);
    puVar28 = (undefined1 *)(ulong)uVar24;
    if (local_68._M_head_impl != (Function *)0x0) {
      operator_delete(local_68._M_head_impl,0x58);
    }
    break;
  case 3:
    parseGlobal(local_90,(Element *)local_38,true);
    puVar3 = (pSVar15->wasm->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    _Var4._M_head_impl =
         puVar3[-1]._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
         _M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
         super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
    *(size_t *)&((Name *)((long)&(_Var4._M_head_impl)->super_Importable + 0x18))->super_IString =
         sVar17;
    *(char **)((long)&(_Var4._M_head_impl)->super_Importable + 0x20) = local_70;
    *(string_view *)
     ((long)&(puVar3[-1]._M_t.
              super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
              super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->super_Importable + 0x28) =
         sVar32;
    puVar28 = (undefined1 *)(ulong)((int)local_48 + 1);
    break;
  case 4:
    curr_00 = (Tag *)operator_new(0x48);
    pSVar15 = local_90;
    (curr_00->super_Importable).super_Named.name.super_IString.str._M_len = 0;
    (curr_00->super_Importable).super_Named.name.super_IString.str._M_str = (char *)0x0;
    *(undefined8 *)&(curr_00->super_Importable).super_Named.hasExplicitName = 0;
    (curr_00->super_Importable).module.super_IString.str._M_len = 0;
    (curr_00->super_Importable).module.super_IString.str._M_str = (char *)0x0;
    (curr_00->super_Importable).base.super_IString.str._M_len = 0;
    (curr_00->super_Importable).base.super_IString.str._M_str = (char *)0x0;
    (curr_00->sig).params.id = 0;
    (curr_00->sig).results.id = 0;
    local_68._M_head_impl = (Function *)0x1;
    local_48 = (undefined1 *)
               parseTypeUse(local_90,(Element *)local_38,(size_t)local_48,(HeapType *)&local_68);
    SVar33 = HeapType::getSignature((HeapType *)&local_68);
    curr_00->sig = SVar33;
    (curr_00->super_Importable).super_Named.name.super_IString.str._M_len = local_88._M_len;
    (curr_00->super_Importable).super_Named.name.super_IString.str._M_str = local_88._M_str;
    (curr_00->super_Importable).super_Named.hasExplicitName = SUB41(local_3c,0);
    (curr_00->super_Importable).module.super_IString.str._M_len = sVar17;
    (curr_00->super_Importable).module.super_IString.str._M_str = local_70;
    (curr_00->super_Importable).base.super_IString.str = sVar32;
    Module::addTag(pSVar15->wasm,curr_00);
    puVar28 = local_48;
    s_01 = local_38;
  }
  pLVar12 = Element::list((Element *)s_01);
  if (((ulong)puVar28 & 0xffffffff) <
      (pLVar12->super_ArenaVectorBase<ArenaVector<wasm::Element_*>,_wasm::Element_*>).usedElements)
  {
    psVar21 = (string *)__cxa_allocate_exception(0x30);
    local_d8 = local_c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"invalid element","");
    pEVar13 = Element::operator[]((Element *)local_38,(uint)puVar28);
    sVar17 = pEVar13->line;
    pEVar13 = Element::operator[]((Element *)local_38,(uint)puVar28);
    sVar5 = pEVar13->col;
    *(string **)psVar21 = psVar21 + 0x10;
    std::__cxx11::string::_M_construct<char*>(psVar21,local_d8,local_d8 + local_d0);
    *(size_t *)(psVar21 + 0x20) = sVar17;
    *(size_t *)(psVar21 + 0x28) = sVar5;
    __cxa_throw(psVar21,&ParseException::typeinfo,ParseException::~ParseException);
  }
  return;
}

Assistant:

void SExpressionWasmBuilder::parseImport(Element& s) {
  size_t i = 1;
  // (import "env" "STACKTOP" (global $stackTop i32))
  bool newStyle = s.size() == 4 && s[3]->isList();
  auto kind = ExternalKind::Invalid;
  if (newStyle) {
    if (elementStartsWith(*s[3], FUNC)) {
      kind = ExternalKind::Function;
    } else if (elementStartsWith(*s[3], MEMORY)) {
      kind = ExternalKind::Memory;
    } else if (elementStartsWith(*s[3], TABLE)) {
      kind = ExternalKind::Table;
    } else if (elementStartsWith(*s[3], GLOBAL)) {
      kind = ExternalKind::Global;
    } else if ((*s[3])[0]->str() == TAG) {
      kind = ExternalKind::Tag;
    } else {
      newStyle = false; // either (param..) or (result..)
    }
  }
  Index newStyleInner = 1;
  Name name;
  if (s.size() > 3 && s[3]->isStr()) {
    name = s[i++]->str();
  } else if (newStyle && newStyleInner < s[3]->size() &&
             (*s[3])[newStyleInner]->dollared()) {
    name = (*s[3])[newStyleInner++]->str();
  }
  bool hasExplicitName = name.is();
  if (!hasExplicitName) {
    if (kind == ExternalKind::Function) {
      name = Name("fimport$" + std::to_string(functionCounter++));
      functionNames.push_back(name);
    } else if (kind == ExternalKind::Global) {
      // Handled in `parseGlobal`.
    } else if (kind == ExternalKind::Memory) {
      name = Name("mimport$" + std::to_string(memoryCounter++));
    } else if (kind == ExternalKind::Table) {
      name = Name("timport$" + std::to_string(tableCounter++));
    } else if (kind == ExternalKind::Tag) {
      name = Name("eimport$" + std::to_string(tagCounter++));
      tagNames.push_back(name);
    } else {
      throw ParseException("invalid import", s[3]->line, s[3]->col);
    }
  }
  if (!newStyle) {
    kind = ExternalKind::Function;
  }
  auto module = s[i++]->str();
  if (!s[i]->isStr()) {
    throw ParseException("no name for import", s[i]->line, s[i]->col);
  }
  auto base = s[i]->str();
  if (!module.size() || !base.size()) {
    throw ParseException(
      "imports must have module and base", s[i]->line, s[i]->col);
  }
  i++;
  // parse internals
  Element& inner = newStyle ? *s[3] : s;
  Index j = newStyle ? newStyleInner : i;
  if (kind == ExternalKind::Function) {
    auto func = std::make_unique<Function>();

    j = parseTypeUse(inner, j, func->type);
    func->setName(name, hasExplicitName);
    func->module = module;
    func->base = base;
    functionTypes[name] = func->type;
    wasm.addFunction(func.release());
  } else if (kind == ExternalKind::Global) {
    parseGlobal(inner, true);
    j++;
    auto& global = wasm.globals.back();
    global->module = module;
    global->base = base;
  } else if (kind == ExternalKind::Table) {
    auto table = std::make_unique<Table>();
    table->setName(name, hasExplicitName);
    table->module = module;
    table->base = base;
    tableNames.push_back(name);

    if (j < inner.size() - 1) {
      auto initElem = inner[j++];
      table->initial = getAddress(initElem);
      checkAddress(table->initial, "excessive table init size", initElem);
    }
    if (j < inner.size() - 1) {
      auto maxElem = inner[j++];
      table->max = getAddress(maxElem);
      checkAddress(table->max, "excessive table max size", maxElem);
    } else {
      table->max = Table::kUnlimitedSize;
    }

    wasm.addTable(std::move(table));

    j++; // funcref
    // ends with the table element type
  } else if (kind == ExternalKind::Memory) {
    auto memory = std::make_unique<Memory>();
    memory->setName(name, hasExplicitName);
    memory->module = module;
    memory->base = base;
    memoryNames.push_back(name);

    if (inner[j]->isList()) {
      auto& limits = *inner[j];
      if (!elementStartsWith(limits, SHARED)) {
        throw ParseException(
          "bad memory limit declaration", inner[j]->line, inner[j]->col);
      }
      memory->shared = true;
      j = parseMemoryLimits(limits, 1, memory);
    } else {
      j = parseMemoryLimits(inner, j, memory);
    }

    wasm.addMemory(std::move(memory));
  } else if (kind == ExternalKind::Tag) {
    auto tag = std::make_unique<Tag>();
    HeapType tagType;
    j = parseTypeUse(inner, j, tagType);
    tag->sig = tagType.getSignature();
    tag->setName(name, hasExplicitName);
    tag->module = module;
    tag->base = base;
    wasm.addTag(tag.release());
  }
  // If there are more elements, they are invalid
  if (j < inner.size()) {
    throw ParseException("invalid element", inner[j]->line, inner[j]->col);
  }
}